

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O2

void Wlc_BlastReduceMatrix(Gia_Man_t *pNew,Vec_Wec_t *vProds,Vec_Wec_t *vLevels,Vec_Int_t *vRes)

{
  int nBits;
  uint i;
  int iVar1;
  int b;
  int c;
  int iVar2;
  int iVar3;
  int iVar4;
  Vec_Int_t *pVVar5;
  Vec_Int_t *pVVar6;
  int iVar7;
  ulong uVar8;
  int NodeC;
  int NodeS;
  Gia_Man_t *local_48;
  Vec_Wec_t *local_40;
  ulong local_38;
  
  nBits = vProds->nSize;
  local_48 = pNew;
  if (nBits != vLevels->nSize) {
    __assert_fail("nSize == Vec_WecSize(vLevels)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcBlast.c"
                  ,0x27d,
                  "void Wlc_BlastReduceMatrix(Gia_Man_t *, Vec_Wec_t *, Vec_Wec_t *, Vec_Int_t *)");
  }
  uVar8 = 0;
  local_40 = vProds;
  iVar7 = 0;
  if (0 < nBits) {
    iVar7 = nBits;
  }
  while ((int)uVar8 != iVar7) {
    i = (int)uVar8 + 1;
    local_38 = uVar8;
    while( true ) {
      pVVar5 = Vec_WecEntry(vProds,(int)uVar8);
      if (pVVar5->nSize < 3) break;
      iVar1 = Vec_IntPop(pVVar5);
      b = Vec_IntPop(pVVar5);
      c = Vec_IntPop(pVVar5);
      pVVar6 = Vec_WecEntry(vLevels,(int)uVar8);
      iVar2 = Vec_IntPop(pVVar6);
      iVar3 = Vec_IntPop(pVVar6);
      iVar4 = Vec_IntPop(pVVar6);
      Wlc_BlastFullAdder(local_48,iVar1,b,c,&NodeC,&NodeS);
      vProds = local_40;
      if (iVar3 < iVar2) {
        iVar3 = iVar2;
      }
      if (iVar3 <= iVar4) {
        iVar3 = iVar4;
      }
      Wlc_IntInsert(pVVar5,pVVar6,NodeS,iVar3 + 2);
      pVVar5 = Vec_WecEntry(vProds,i);
      pVVar6 = Vec_WecEntry(vLevels,i);
      uVar8 = local_38;
      Wlc_IntInsert(pVVar5,pVVar6,NodeC,iVar3 + 1);
    }
    uVar8 = (ulong)i;
  }
  iVar3 = 0;
  do {
    if (iVar3 == iVar7) {
      pVVar5 = Vec_WecEntry(vLevels,0);
      vRes->nSize = 0;
      pVVar5->nSize = 0;
      for (iVar3 = 0; iVar7 != iVar3; iVar3 = iVar3 + 1) {
        pVVar6 = Vec_WecEntry(vProds,iVar3);
        iVar1 = Vec_IntEntry(pVVar6,0);
        Vec_IntPush(vRes,iVar1);
        iVar1 = Vec_IntEntry(pVVar6,1);
        Vec_IntPush(pVVar5,iVar1);
      }
      Wlc_BlastAdder(local_48,vRes->pArray,pVVar5->pArray,nBits);
      return;
    }
    pVVar5 = Vec_WecEntry(vProds,iVar3);
    while (pVVar5->nSize < 2) {
      Vec_IntPush(pVVar5,0);
    }
    iVar3 = iVar3 + 1;
  } while (pVVar5->nSize == 2);
  __assert_fail("Vec_IntSize(vProd) == 2",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcBlast.c"
                ,0x2a3,
                "void Wlc_BlastReduceMatrix(Gia_Man_t *, Vec_Wec_t *, Vec_Wec_t *, Vec_Int_t *)");
}

Assistant:

void Wlc_BlastReduceMatrix( Gia_Man_t * pNew, Vec_Wec_t * vProds, Vec_Wec_t * vLevels, Vec_Int_t * vRes )
{
    Vec_Int_t * vLevel, * vProd;
    int i, NodeS, NodeC, LevelS, LevelC, Node1, Node2, Node3, Level1, Level2, Level3;
    int nSize = Vec_WecSize(vProds);
    assert( nSize == Vec_WecSize(vLevels) );
    for ( i = 0; i < nSize; i++ )
    {
        while ( 1 )
        {
            vProd  = Vec_WecEntry( vProds, i );
            if ( Vec_IntSize(vProd) < 3 )
                break;

            Node1  = Vec_IntPop( vProd );
            Node2  = Vec_IntPop( vProd );
            Node3  = Vec_IntPop( vProd );

            vLevel = Vec_WecEntry( vLevels, i );

            Level1 = Vec_IntPop( vLevel );
            Level2 = Vec_IntPop( vLevel );
            Level3 = Vec_IntPop( vLevel );

            Wlc_BlastFullAdder( pNew, Node1, Node2, Node3, &NodeC, &NodeS );
            LevelS = Abc_MaxInt( Abc_MaxInt(Level1, Level2), Level3 ) + 2;
            LevelC = LevelS - 1;

            Wlc_IntInsert( vProd, vLevel, NodeS, LevelS );

            vProd  = Vec_WecEntry( vProds, i+1 );
            vLevel = Vec_WecEntry( vLevels, i+1 );

            Wlc_IntInsert( vProd, vLevel, NodeC, LevelC );
        }
    }

    // make all ranks have two products
    for ( i = 0; i < nSize; i++ )
    {
        vProd  = Vec_WecEntry( vProds, i );
        while ( Vec_IntSize(vProd) < 2 )
            Vec_IntPush( vProd, 0 );
        assert( Vec_IntSize(vProd) == 2 );
    }

    vLevel = Vec_WecEntry( vLevels, 0 );
    Vec_IntClear( vRes );
    Vec_IntClear( vLevel );
    for ( i = 0; i < nSize; i++ )
    {
        vProd  = Vec_WecEntry( vProds, i );
        Vec_IntPush( vRes,   Vec_IntEntry(vProd, 0) );
        Vec_IntPush( vLevel, Vec_IntEntry(vProd, 1) );
    }
    Wlc_BlastAdder( pNew, Vec_IntArray(vRes), Vec_IntArray(vLevel), nSize );
}